

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::WedgeUtilsSSEFuncTest_ResidualBlendingMethod_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::WedgeUtilsSSEFuncTest_ResidualBlendingMethod_Test>
           *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x18);
  anon_unknown.dwarf_f9fae3::WedgeUtilsSSEFuncTest_ResidualBlendingMethod_Test::
  WedgeUtilsSSEFuncTest_ResidualBlendingMethod_Test
            ((WedgeUtilsSSEFuncTest_ResidualBlendingMethod_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }